

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::utcTimeAndDate(Forth *this)

{
  tm *ptVar1;
  ForthStack<unsigned_int> *pFVar2;
  uint x;
  time_t t;
  time_t local_20;
  
  requireDStackAvailable(this,6,"UTCTIME&DATE");
  x = 0;
  local_20 = time((time_t *)0x0);
  ptVar1 = gmtime(&local_20);
  if (ptVar1 == (tm *)0x0) {
    pFVar2 = &this->dStack;
    ForthStack<unsigned_int>::push(pFVar2,0);
    ForthStack<unsigned_int>::push(pFVar2,0);
    ForthStack<unsigned_int>::push(pFVar2,0);
    ForthStack<unsigned_int>::push(pFVar2,1);
    ForthStack<unsigned_int>::push(pFVar2,1);
  }
  else {
    pFVar2 = &this->dStack;
    ForthStack<unsigned_int>::push(pFVar2,ptVar1->tm_sec);
    ForthStack<unsigned_int>::push(pFVar2,ptVar1->tm_min);
    ForthStack<unsigned_int>::push(pFVar2,ptVar1->tm_hour);
    ForthStack<unsigned_int>::push(pFVar2,ptVar1->tm_mday);
    ForthStack<unsigned_int>::push(pFVar2,ptVar1->tm_mon + 1);
    x = ptVar1->tm_year + 0x76c;
  }
  ForthStack<unsigned_int>::push(&this->dStack,x);
  return;
}

Assistant:

void utcTimeAndDate() {
			REQUIRE_DSTACK_AVAILABLE(6, "UTCTIME&DATE");
			auto t = std::time(0);
			tm *tm{};
			tm=std::gmtime( &t);
			push(static_cast<Cell>(tm? tm->tm_sec:0));
			push(static_cast<Cell>(tm ? tm->tm_min:0));
			push(static_cast<Cell>(tm ? tm->tm_hour : 0));
			push(static_cast<Cell>(tm ? tm->tm_mday : 1));
			push(static_cast<Cell>(tm ? tm->tm_mon + 1 : 1));
			push(static_cast<Cell>(tm ? tm->tm_year + 1900 : 0));
		}